

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.cpp
# Opt level: O0

RGB __thiscall
RayTracerTriangles::processPixelOnTriangle
          (RayTracerTriangles *this,Point *rayBeg,Point *pointOnTriangle,Triangle *triangle,
          int recursionLevel)

{
  bool bVar1;
  RGB RVar2;
  RGB local_a0;
  RGB local_98;
  undefined1 auStack_88 [5];
  RGB reflectedColor;
  undefined1 local_6c [8];
  Segment refl;
  undefined2 local_3b;
  uint8_t local_39;
  RGB resultCol;
  RGB color;
  bool isInShadow;
  int recursionLevel_local;
  Triangle *triangle_local;
  Point *pointOnTriangle_local;
  Point *rayBeg_local;
  RayTracerTriangles *this_local;
  
  bVar1 = pointInShadow(this,pointOnTriangle,triangle);
  RVar2 = colorOfPoint(pointOnTriangle,triangle);
  if (bVar1) {
    RVar2 = operator*(RVar2,(this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient);
    local_3b = RVar2._0_2_;
    local_39 = RVar2.b;
  }
  else {
    refl.b.y._0_3_ = RVar2;
    refl.b.z._2_2_ = RVar2._0_2_;
    RVar2 = calculateColorInLight(this,pointOnTriangle,triangle,RVar2);
    local_3b = RVar2._0_2_;
    local_39 = RVar2.b;
  }
  if (recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) {
    bVar1 = isCloseToZero<float>(triangle->reflectionCoefficient);
    if (!bVar1) {
      auStack_88._0_4_ = rayBeg->x;
      unique0x00012004 = rayBeg->y;
      randomReflection((Segment *)local_6c,(Segment *)auStack_88,triangle);
      RVar2 = processPixel(this,(Segment *)local_6c,recursionLevel + 1);
      local_98.b = local_39;
      local_98.r = (undefined1)local_3b;
      local_98.g = local_3b._1_1_;
      RVar2 = calculateColorFromReflection(local_98,RVar2,triangle->reflectionCoefficient);
      this_local._5_2_ = RVar2._0_2_;
      this_local._7_1_ = RVar2.b;
      goto LAB_00114697;
    }
  }
  this_local._5_2_ = local_3b;
  this_local._7_1_ = local_39;
LAB_00114697:
  local_a0.b = this_local._7_1_;
  local_a0.r = this_local._5_1_;
  local_a0.g = this_local._6_1_;
  return local_a0;
}

Assistant:

RGB RayTracerTriangles::processPixelOnTriangle(Point const& rayBeg, Point const& pointOnTriangle,
                                               Triangle const& triangle, int recursionLevel)
{
  bool const isInShadow = pointInShadow(pointOnTriangle, triangle);
  RGB color = colorOfPoint(pointOnTriangle, triangle);

  RGB resultCol;
  if (isInShadow)
    resultCol = color * config.ambientCoefficient;
  else
    resultCol = calculateColorInLight(pointOnTriangle, triangle, color);

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(triangle.reflectionCoefficient))
    return resultCol;

  Segment refl = randomReflection({rayBeg, pointOnTriangle}, triangle);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, triangle.reflectionCoefficient);
}